

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_> *
winmd::reader::parse_cmods
          (vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
           *__return_storage_ptr__,table_base *table,byte_view *data)

{
  uint32_t uVar1;
  byte_view cursor;
  table_base *local_40;
  byte_view local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_first = data->m_first;
  local_38.m_last = data->m_last;
  local_40 = table;
  uVar1 = uncompress_unsigned(&local_38);
  while ((byte)((char)uVar1 - 0x1fU) < 2) {
    std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>::
    emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              ((vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>> *)
               __return_storage_ptr__,&local_40,data);
    local_38.m_first = data->m_first;
    local_38.m_last = data->m_last;
    uVar1 = uncompress_unsigned(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<CustomModSig> parse_cmods(table_base const* table, byte_view& data)
    {
        std::vector<CustomModSig> result;
        auto cursor = data;

        for (auto element_type = uncompress_enum<ElementType>(cursor);
            element_type == ElementType::CModOpt || element_type == ElementType::CModReqd;
            element_type = uncompress_enum<ElementType>(cursor))
        {
            result.emplace_back(table, data);
            cursor = data;
        }
        return result;
    }